

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * getTypedProperty<std::__cxx11::string>
                   (string *__return_storage_ptr__,cmGeneratorTarget *tgt,string *prop,
                   cmGeneratorExpressionInterpreter *genexInterpreter)

{
  char *expression;
  string *psVar1;
  char *value;
  cmGeneratorExpressionInterpreter *genexInterpreter_local;
  string *prop_local;
  cmGeneratorTarget *tgt_local;
  
  expression = cmGeneratorTarget::GetProperty(tgt,prop);
  if (genexInterpreter == (cmGeneratorExpressionInterpreter *)0x0) {
    valueAsString<char_const*>(__return_storage_ptr__,expression);
  }
  else {
    psVar1 = cmGeneratorExpressionInterpreter::Evaluate(genexInterpreter,expression,prop);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getTypedProperty<std::string>(
  cmGeneratorTarget const* tgt, const std::string& prop,
  cmGeneratorExpressionInterpreter* genexInterpreter)
{
  const char* value = tgt->GetProperty(prop);

  if (genexInterpreter == nullptr) {
    return valueAsString(value);
  }

  return genexInterpreter->Evaluate(value, prop);
}